

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.cc
# Opt level: O1

void tvm::contrib::argsort<float,float>
               (DLTensor *input,DLTensor *output,int32_t axis,bool is_ascend)

{
  iterator __last;
  uint uVar1;
  undefined7 in_register_00000009;
  __normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
  _Var2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_> sorter;
  uint local_b4;
  undefined1 local_b0 [16];
  pair<long,_float> *local_a0;
  __normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
  local_98;
  iterator iStack_90;
  pair<long,_float> *local_88;
  long local_78;
  undefined4 local_6c;
  long local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  void *local_48;
  void *local_40;
  ulong local_38;
  
  local_6c = (undefined4)CONCAT71(in_register_00000009,is_ascend);
  local_40 = input->data;
  local_48 = output->data;
  local_98._M_current = (pair<long,_float> *)0x0;
  iStack_90._M_current = (pair<long,_float> *)0x0;
  local_88 = (pair<long,_float> *)0x0;
  lVar5 = (long)axis;
  if ((long)input->ndim < 1) {
    local_b4 = 1;
    uVar1 = 1;
  }
  else {
    uVar1 = 1;
    lVar3 = 0;
    local_b4 = 1;
    do {
      if (lVar3 < lVar5) {
        uVar1 = uVar1 * (int)input->shape[lVar3];
      }
      else if (lVar5 < lVar3) {
        local_b4 = local_b4 * (int)input->shape[lVar3];
      }
      lVar3 = lVar3 + 1;
    } while (input->ndim != lVar3);
  }
  if (0 < (int)uVar1) {
    lVar3 = (long)(int)local_b4;
    local_60 = (ulong)uVar1;
    local_38 = (ulong)local_b4;
    local_78 = 0;
    uVar7 = 0;
    local_58 = lVar3;
    do {
      local_50 = uVar7;
      if (0 < (int)local_b4) {
        uVar7 = 0;
        do {
          if (iStack_90._M_current != local_98._M_current) {
            iStack_90._M_current = local_98._M_current;
          }
          local_68 = input->shape[lVar5];
          if (0 < local_68) {
            pfVar4 = (float *)((long)local_40 + (local_78 * local_68 + uVar7) * 4);
            lVar6 = 0;
            do {
              local_b0._8_4_ = *pfVar4;
              local_b0._0_8_ = lVar6;
              if (iStack_90._M_current == local_88) {
                std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>::
                _M_realloc_insert<std::pair<long,float>>
                          ((vector<std::pair<long,float>,std::allocator<std::pair<long,float>>> *)
                           &local_98,iStack_90,(pair<long,_float> *)local_b0);
              }
              else {
                (iStack_90._M_current)->first = lVar6;
                *(ulong *)&(iStack_90._M_current)->second = CONCAT44(local_b0._12_4_,local_b0._8_4_)
                ;
                iStack_90._M_current = iStack_90._M_current + 1;
              }
              lVar6 = lVar6 + 1;
              pfVar4 = pfVar4 + lVar3;
            } while (lVar6 < input->shape[lVar5]);
          }
          __last._M_current = iStack_90._M_current;
          _Var2._M_current = local_98._M_current;
          if ((char)local_6c == '\0') {
            if (local_98._M_current != iStack_90._M_current) {
              lVar6 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
              std::
              _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>,_std::pair<long,_float>_>
              ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>,_std::pair<long,_float>_>
                                   *)local_b0,local_98,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
              if (local_a0 == (pair<long,_float> *)0x0) {
                std::
                __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>>
                          (_Var2,(__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                                  )__last._M_current,
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_float>_&,_const_std::pair<long,_float>_&)>
                            )0x127d1a);
              }
              else {
                std::
                __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,std::pair<long,float>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>>
                          (_Var2,(__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                                  )__last._M_current,local_a0,
                           CONCAT44(local_b0._12_4_,local_b0._8_4_),
                           (_Iter_comp_iter<bool_(*)(const_std::pair<long,_float>_&,_const_std::pair<long,_float>_&)>
                            )0x127d1a);
              }
              goto LAB_0012994c;
            }
          }
          else if (local_98._M_current != iStack_90._M_current) {
            lVar6 = (long)iStack_90._M_current - (long)local_98._M_current >> 4;
            std::
            _Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>,_std::pair<long,_float>_>
            ::_Temporary_buffer((_Temporary_buffer<__gnu_cxx::__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>,_std::pair<long,_float>_>
                                 *)local_b0,local_98,(lVar6 - (lVar6 + 1 >> 0x3f)) + 1 >> 1);
            if (local_a0 == (pair<long,_float> *)0x0) {
              std::
              __inplace_stable_sort<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>>
                        (_Var2,(__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                                )__last._M_current,
                         (_Iter_comp_iter<bool_(*)(const_std::pair<long,_float>_&,_const_std::pair<long,_float>_&)>
                          )0x127d0d);
            }
            else {
              std::
              __stable_sort_adaptive<__gnu_cxx::__normal_iterator<std::pair<long,float>*,std::vector<std::pair<long,float>,std::allocator<std::pair<long,float>>>>,std::pair<long,float>*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(std::pair<long,float>const&,std::pair<long,float>const&)>>
                        (_Var2,(__normal_iterator<std::pair<long,_float>_*,_std::vector<std::pair<long,_float>,_std::allocator<std::pair<long,_float>_>_>_>
                                )__last._M_current,local_a0,CONCAT44(local_b0._12_4_,local_b0._8_4_)
                         ,(_Iter_comp_iter<bool_(*)(const_std::pair<long,_float>_&,_const_std::pair<long,_float>_&)>
                           )0x127d0d);
            }
LAB_0012994c:
            operator_delete(local_a0,CONCAT44(local_b0._12_4_,local_b0._8_4_) << 4);
          }
          lVar6 = input->shape[lVar5];
          if (0 < lVar6) {
            pfVar4 = (float *)((long)local_48 + (local_68 * local_78 + uVar7) * 4);
            _Var2._M_current = local_98._M_current;
            do {
              *pfVar4 = (float)(_Var2._M_current)->first;
              pfVar4 = pfVar4 + lVar3;
              _Var2._M_current = _Var2._M_current + 1;
              lVar6 = lVar6 + -1;
            } while (lVar6 != 0);
          }
          uVar7 = uVar7 + 1;
        } while (uVar7 != local_38);
      }
      uVar7 = local_50 + 1;
      local_78 = local_78 + local_58;
    } while (uVar7 != local_60);
  }
  if (local_98._M_current != (pair<long,_float> *)0x0) {
    operator_delete(local_98._M_current,(long)local_88 - (long)local_98._M_current);
  }
  return;
}

Assistant:

void argsort(DLTensor *input, DLTensor *output, int32_t axis, bool is_ascend) {
  auto data_ptr = static_cast<DataType *>(input->data);
  auto out_ptr = static_cast<OutType *>(output->data);
  std::vector<std::pair<int64_t, DataType>> sorter;

  int axis_mul_before = 1;
  int axis_mul_after = 1;
  for (int i = 0; i < input->ndim; ++i) {
    if (i < axis) {
      axis_mul_before *= input->shape[i];
    } else if (i > axis) {
      axis_mul_after *= input->shape[i];
    }
  }

  for (int i = 0; i < axis_mul_before; ++i) {
    for (int j = 0; j < axis_mul_after; ++j) {
      sorter.clear();
      int64_t base_idx = i * input->shape[axis] * axis_mul_after + j;
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        int64_t full_idx = base_idx + k * axis_mul_after;
        sorter.emplace_back(std::make_pair(k, data_ptr[full_idx]));
      }
      if (is_ascend) {
        std::stable_sort(sorter.begin(), sorter.end(), CompareAscend<DataType>);
      } else {
        std::stable_sort(sorter.begin(), sorter.end(), CompareDescend<DataType>);
      }
      for (int64_t k = 0; k < input->shape[axis]; ++k) {
        out_ptr[base_idx + k * axis_mul_after] = static_cast<OutType>(sorter[k].first);
      }
    }
  }
}